

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_SessionPropertiesThreads_Test::TestBody
          (SSLVersionTest_SessionPropertiesThreads_Test *this)

{
  uint16_t uVar1;
  uint16_t uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  internal iVar6;
  long lVar7;
  ulong uVar8;
  ssl_session_st *psVar9;
  ssl_session_st *psVar10;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_00;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_01;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_02;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_03;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_04;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_05;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_06;
  anon_class_16_2_b278af79_for__M_head_impl *extraout_RDX_07;
  anon_class_16_2_b278af79_for__M_head_impl *__args;
  thread *thread;
  ulong uVar11;
  ssl_session_st *psVar12;
  _Head_base<0UL,_ssl_session_st_*,_false> _Var13;
  char *in_R9;
  char *pcVar14;
  pointer *__ptr;
  AssertionResult gtest_ar__4;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  UniquePtr<SSL> ssls [4];
  UniquePtr<SSL_SESSION> session;
  ClientConfig config;
  thread local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 local_f8 [32];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  AssertHelper local_d0;
  UniquePtr<SSL> local_c8;
  _Head_base<0UL,_ssl_st_*,_false> local_c0;
  UniquePtr<SSL> local_b8;
  UniquePtr<SSL> local_b0 [2];
  unique_ptr<ssl_session_st,_bssl::internal::Deleter> local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  size_type sStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  ulong local_48 [2];
  size_type local_38;
  
  bVar5 = SSLVersionTest::is_tls13(&this->super_SSLVersionTest);
  if (bVar5) {
    local_88._24_8_ = 0;
    local_58._8_8_ = 0;
    local_98._0_8_ = (SSL_SESSION *)0x0;
    local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
    local_88._8_8_ = 0;
    local_88._16_8_ = 0;
    sStack_60 = 0;
    local_58._M_allocated_capacity = 0;
    local_48[0]._0_1_ = '\0';
    local_48[0]._1_1_ = '\0';
    local_48[0]._2_1_ = '\0';
    local_48[0]._3_1_ = '\0';
    local_48[0]._4_1_ = '\0';
    local_48[0]._5_1_ = '\0';
    local_48[0]._6_1_ = '\0';
    local_48[0]._7_1_ = '\0';
    local_88._0_8_ = local_88 + 0x10;
    local_68._M_p = (pointer)&local_58;
    CreateClientSession((anon_unknown_0 *)local_f8,
                        (this->super_SSLVersionTest).client_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (this->super_SSLVersionTest).server_ctx_._M_t.
                        super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                        (ClientConfig *)local_98);
    local_c8._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>
    ._M_head_impl._0_1_ = (internal)((ssl_session_st *)local_f8._0_8_ == (ssl_session_st *)0x0);
    local_c0._M_head_impl = (ssl_st *)0x0;
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    if (local_c8._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_f8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_98,(internal *)&local_c8,
                 (AssertionResult *)"CreateClientSession(client_ctx_.get(), server_ctx_.get())",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a4d,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if ((SSL_SESSION *)local_98._0_8_ != (SSL_SESSION *)local_88) {
        operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
      }
      if ((_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)local_f8._0_8_ !=
          (ssl_session_st *)0x0) {
        (**(code **)((native_handle_type)*(id *)local_f8._0_8_ + 8))();
      }
    }
    if (local_c0._M_head_impl == (ssl_st *)0x0) {
      return;
    }
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c0._M_head_impl);
    return;
  }
  SSL_CTX_set_options((this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0x4000);
  SSL_CTX_set_session_cache_mode
            ((this->super_SSLVersionTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  SSL_CTX_set_session_cache_mode
            ((this->super_SSLVersionTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
  iVar6 = (internal)
          SSLVersionTest::UseCertAndKey
                    (&this->super_SSLVersionTest,
                     (this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  local_c0._M_head_impl = (ssl_st *)0x0;
  local_c8._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl._0_1_ = iVar6;
  if (!(bool)iVar6) {
    testing::Message::Message((Message *)local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_c8,
               (AssertionResult *)"UseCertAndKey(client_ctx_.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a55,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((SSL_SESSION *)local_98._0_8_ != (SSL_SESSION *)local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
    }
    if ((ssl_session_st *)local_f8._0_8_ != (ssl_session_st *)0x0) {
      (**(code **)((native_handle_type)*(id *)local_f8._0_8_ + 8))();
    }
  }
  if (local_c0._M_head_impl != (ssl_st *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c0._M_head_impl);
  }
  if (!(bool)iVar6) {
    return;
  }
  iVar6 = (internal)
          SSLVersionTest::UseCertAndKey
                    (&this->super_SSLVersionTest,
                     (this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  local_c0._M_head_impl = (ssl_st *)0x0;
  local_c8._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl._0_1_ = iVar6;
  if (!(bool)iVar6) {
    testing::Message::Message((Message *)local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_c8,
               (AssertionResult *)"UseCertAndKey(server_ctx_.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a56,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((SSL_SESSION *)local_98._0_8_ != (SSL_SESSION *)local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
    }
    if ((ssl_session_st *)local_f8._0_8_ != (ssl_session_st *)0x0) {
      (**(code **)((native_handle_type)*(id *)local_f8._0_8_ + 8))();
    }
  }
  if (local_c0._M_head_impl != (ssl_st *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_c0._M_head_impl);
  }
  if (!(bool)iVar6) {
    return;
  }
  SSL_CTX_set_custom_verify
            ((this->super_SSLVersionTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1,
             TestBody::anon_class_1_0_00000001::__invoke);
  SSL_CTX_set_custom_verify
            ((this->super_SSLVersionTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,1,
             TestBody::anon_class_1_0_00000001::__invoke);
  local_88._0_8_ = local_88 + 0x10;
  local_88._24_8_ = 0;
  local_58._8_8_ = 0;
  local_98._0_8_ = (SSL_SESSION *)0x0;
  local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 0;
  sStack_60 = 0;
  local_58._M_allocated_capacity = 0;
  local_48[0] = 0;
  local_68._M_p = (pointer)&local_58;
  CreateClientSession((anon_unknown_0 *)&local_a0,
                      (this->super_SSLVersionTest).client_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      (this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                      (ClientConfig *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  local_c8._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl._0_1_ =
       (internal)
       (local_a0._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0);
  local_c0._M_head_impl = (ssl_st *)0x0;
  if (local_a0._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_98,(internal *)&local_c8,(AssertionResult *)0x35c794,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a63,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((SSL_SESSION *)local_98._0_8_ != (SSL_SESSION *)local_88) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_88._0_8_ + 1));
    }
    if ((ssl_session_st *)local_f8._0_8_ != (ssl_session_st *)0x0) {
      (**(code **)((native_handle_type)*(id *)local_f8._0_8_ + 8))();
    }
    if (local_c0._M_head_impl != (ssl_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_c0._M_head_impl);
    }
    goto LAB_001b8c8b;
  }
  lVar7 = 0;
  do {
    *(undefined8 *)
     ((long)&local_c8._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + lVar7) = 0;
    lVar7 = lVar7 + 8;
  } while (lVar7 != 0x20);
  local_98._8_8_ = (stack_st_CRYPTO_BUFFER *)0x0;
  local_88._0_8_ = local_88 + 0x10;
  local_88._8_8_ = 0;
  local_88._16_8_ = local_88._16_8_ & 0xffffffffffffff00;
  local_68._M_p = (pointer)&local_58;
  sStack_60 = 0;
  local_58._M_allocated_capacity = local_58._M_allocated_capacity & 0xffffffffffffff00;
  local_48[0] = local_48[0] & 0xffffff0000000000;
  local_98._0_8_ =
       local_a0._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  pcVar14 = (char *)0x1;
  iVar6 = (internal)
          ConnectClientAndServer
                    (&local_c8,(UniquePtr<SSL> *)&local_c0,
                     (this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (ClientConfig *)local_98,true);
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_108._M_id._M_thread._0_1_ = iVar6;
  if ((bool)iVar6) {
LAB_001b8940:
    pcVar14 = (char *)0x1;
    iVar6 = (internal)
            ConnectClientAndServer
                      (&local_b8,local_b0,
                       (this->super_SSLVersionTest).client_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (this->super_SSLVersionTest).server_ctx_._M_t.
                       super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (ClientConfig *)local_98,true);
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    __args = extraout_RDX;
    local_108._M_id._M_thread._0_1_ = iVar6;
    if (!(bool)iVar6) {
      testing::Message::Message((Message *)&local_d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_f8,(internal *)&local_108,
                 (AssertionResult *)
                 "ConnectClientAndServer(&ssls[2], &ssls[3], client_ctx_.get(), server_ctx_.get(), config)"
                 ,"false","true",pcVar14);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1a6c,(char *)local_f8._0_8_);
      testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      __args = extraout_RDX_00;
      if ((ssl_session_st *)local_f8._0_8_ != (ssl_session_st *)(local_f8 + 0x10)) {
        operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
        __args = extraout_RDX_01;
      }
      if (local_d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_d8._M_head_impl + 8))();
        __args = extraout_RDX_02;
      }
      if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_100,local_100);
        __args = extraout_RDX_03;
      }
      if (!(bool)iVar6) goto LAB_001b8c25;
    }
    local_f8._0_8_ = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
    local_f8._8_8_ = (ssl_session_st *)0x0;
    local_f8._16_8_ = (ssl_session_st *)0x0;
    lVar7 = 0;
    do {
      uVar4 = local_f8._8_8_;
      uVar3 = local_f8._0_8_;
      local_100 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   ((long)&local_c8._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t
                           .super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + lVar7);
      if (local_f8._8_8_ == local_f8._16_8_) {
        if (local_f8._8_8_ - local_f8._0_8_ == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar11 = (long)(local_f8._8_8_ - local_f8._0_8_) >> 3;
        uVar8 = uVar11 + (uVar11 == 0);
        local_38 = uVar8 + uVar11;
        if (0xffffffffffffffe < local_38) {
          local_38 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar8,uVar11)) {
          local_38 = 0xfffffffffffffff;
        }
        if (local_38 == 0) {
          psVar9 = (ssl_session_st *)0x0;
        }
        else {
          psVar9 = (ssl_session_st *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)local_f8,local_38,(void *)0x0);
          __args = extraout_RDX_05;
        }
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test::TestBody()::__0>
                  ((allocator_type *)((psVar9->secret).storage_ + uVar11 * 8 + -10),&local_108,
                   __args);
        psVar12 = psVar9;
        for (psVar10 = (ssl_session_st *)uVar3; psVar10 != (ssl_session_st *)uVar4;
            psVar10 = (ssl_session_st *)&psVar10->peer_signature_algorithm) {
          *(id *)psVar12 = (id)0x0;
          uVar1 = psVar10->ssl_version;
          uVar2 = psVar10->group_id;
          psVar12->super_RefCounted<ssl_session_st> =
               (RefCounted<ssl_session_st>)(psVar10->super_RefCounted<ssl_session_st>).references_;
          psVar12->ssl_version = uVar1;
          psVar12->group_id = uVar2;
          *(id *)psVar10 = (id)0x0;
          psVar12 = (ssl_session_st *)&psVar12->peer_signature_algorithm;
        }
        __args = extraout_RDX_06;
        if ((ssl_session_st *)uVar3 != (ssl_session_st *)0x0) {
          operator_delete((void *)uVar3,local_f8._16_8_ - uVar3);
          __args = extraout_RDX_07;
        }
        local_f8._16_8_ = (psVar9->secret).storage_ + local_38 * 8 + -10;
        local_f8._0_8_ = psVar9;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,bssl::(anonymous_namespace)::SSLVersionTest_SessionPropertiesThreads_Test::TestBody()::__0>
                  ((allocator_type *)local_f8._8_8_,&local_108,__args);
        __args = extraout_RDX_04;
        psVar12 = (ssl_session_st *)local_f8._8_8_;
      }
      local_f8._8_8_ = &psVar12->peer_signature_algorithm;
      uVar3 = local_f8._8_8_;
      lVar7 = lVar7 + 8;
      _Var13._M_head_impl = (ssl_session_st *)local_f8._0_8_;
    } while (lVar7 != 0x20);
    for (; _Var13._M_head_impl != (ssl_session_st *)uVar3;
        _Var13._M_head_impl = _Var13._M_head_impl + 8) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector
              ((vector<std::thread,_std::allocator<std::thread>_> *)local_f8);
  }
  else {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)&local_108,
               (AssertionResult *)
               "ConnectClientAndServer(&ssls[0], &ssls[1], client_ctx_.get(), server_ctx_.get(), config)"
               ,"false","true",pcVar14);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1a6a,(char *)local_f8._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((ssl_session_st *)local_f8._0_8_ != (ssl_session_st *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,local_100);
    }
    if ((bool)iVar6) goto LAB_001b8940;
  }
LAB_001b8c25:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  lVar7 = 0x18;
  do {
    std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)
               ((long)&local_c8._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + lVar7));
    lVar7 = lVar7 + -8;
  } while (lVar7 != -8);
LAB_001b8c8b:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&local_a0);
  return;
}

Assistant:

TEST_P(SSLVersionTest, SessionPropertiesThreads) {
  if (is_tls13()) {
    // Our TLS 1.3 implementation does not support stateful resumption.
    ASSERT_FALSE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));
    return;
  }

  SSL_CTX_set_options(server_ctx_.get(), SSL_OP_NO_TICKET);
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);

  ASSERT_TRUE(UseCertAndKey(client_ctx_.get()));
  ASSERT_TRUE(UseCertAndKey(server_ctx_.get()));

  // Configure mutual authentication, so we have more session state.
  SSL_CTX_set_custom_verify(
      client_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_ok; });
  SSL_CTX_set_custom_verify(
      server_ctx_.get(), SSL_VERIFY_PEER,
      [](SSL *ssl, uint8_t *out_alert) { return ssl_verify_ok; });

  // Establish a client session to test with.
  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session);

  // Resume with it twice.
  UniquePtr<SSL> ssls[4];
  ClientConfig config;
  config.session = session.get();
  ASSERT_TRUE(ConnectClientAndServer(&ssls[0], &ssls[1], client_ctx_.get(),
                                     server_ctx_.get(), config));
  ASSERT_TRUE(ConnectClientAndServer(&ssls[2], &ssls[3], client_ctx_.get(),
                                     server_ctx_.get(), config));

  // Read properties in parallel.
  auto read_properties = [](const SSL *ssl) {
    EXPECT_TRUE(SSL_get_peer_cert_chain(ssl));
    bssl::UniquePtr<X509> peer(SSL_get_peer_certificate(ssl));
    EXPECT_TRUE(peer);
    EXPECT_TRUE(SSL_get_current_cipher(ssl));
    EXPECT_TRUE(SSL_get_group_id(ssl));
  };

  std::vector<std::thread> threads;
  for (const auto &ssl_ptr : ssls) {
    const SSL *ssl = ssl_ptr.get();
    threads.emplace_back([=] { read_properties(ssl); });
  }
  for (auto &thread : threads) {
    thread.join();
  }
}